

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::cpp::CppGenerator::~CppGenerator(CppGenerator *this)

{
  CppGenerator *this_local;
  
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_008e4d48;
  std::__cxx11::string::~string((string *)&this->runtime_include_base_);
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  return;
}

Assistant:

CppGenerator::~CppGenerator() {}